

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O1

void __thiscall
crnlib::corpus_tester::print_metric_stats
          (corpus_tester *this,vector<crnlib::image_utils::error_metrics> *stats,uint num_blocks_x,
          uint param_3)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined4 in_register_0000000c;
  ulong uVar3;
  undefined4 in_register_00000014;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  uVar4 = CONCAT44(in_register_00000014,num_blocks_x);
  uVar3 = CONCAT44(in_register_0000000c,param_3);
  if ((ulong)stats->m_size == 0) {
    uVar5 = 0;
    dVar18 = 0.0;
    dVar19 = 0.0;
    dVar17 = 0.0;
    uVar6 = 0;
    uVar12 = 0;
    uVar13 = 0;
    uVar8 = 0;
    uVar11 = 0;
  }
  else {
    uVar3 = (ulong)num_blocks_x;
    pdVar10 = &stats->m_p->mPeakSNR;
    dVar18 = 0.0;
    dVar19 = 0.0;
    dVar17 = 0.0;
    uVar15 = 0;
    uVar16 = 0x412e8480;
    uVar9 = 0;
    uVar11 = 0;
    uVar8 = 0;
    uVar13 = 0;
    uVar12 = 0;
    uVar7 = 0;
    uVar5 = 0;
    do {
      uVar1 = (uVar9 & 0xffffffff) / uVar3;
      uVar4 = (uVar9 & 0xffffffff) % uVar3;
      dVar20 = *pdVar10;
      if (dVar20 < 200.0 && dVar17 < dVar20) {
        uVar7 = uVar4;
        dVar17 = dVar20;
        uVar5 = uVar1;
      }
      uVar6 = (uint)uVar7;
      if (dVar20 <= (double)CONCAT44(uVar16,uVar15) && (double)CONCAT44(uVar16,uVar15) != dVar20) {
        uVar13 = uVar4;
        uVar12 = uVar1;
      }
      if (200.0 <= dVar20) {
        uVar8 = (ulong)((int)uVar8 + 1);
      }
      else {
        dVar18 = dVar18 + dVar20 * dVar20;
        dVar19 = dVar19 + dVar20;
        uVar11 = uVar11 + 1;
      }
      if ((double)CONCAT44(uVar16,uVar15) <= dVar20) {
        dVar20 = (double)CONCAT44(uVar16,uVar15);
      }
      uVar9 = uVar9 + 1;
      pdVar10 = pdVar10 + 5;
      uVar15 = SUB84(dVar20,0);
      uVar16 = (undefined4)((ulong)dVar20 >> 0x20);
    } while (stats->m_size != uVar9);
  }
  console::printf("Number of infinite PSNR blocks: %u",uVar8,uVar4,uVar3);
  console::printf("Number of non-infinite PSNR blocks: %u",(ulong)uVar11);
  if (uVar11 != 0) {
    dVar20 = (double)uVar11;
    auVar2._8_8_ = dVar19;
    auVar2._0_8_ = dVar18;
    auVar14._8_4_ = SUB84(dVar20,0);
    auVar14._0_8_ = dVar20;
    auVar14._12_4_ = (int)((ulong)dVar20 >> 0x20);
    auVar14 = divpd(auVar2,auVar14);
    dVar19 = auVar14._8_8_;
    dVar18 = auVar14._0_8_ - dVar19 * dVar19;
    if (dVar18 < 0.0) {
      dVar18 = sqrt(dVar18);
      uVar15 = SUB84(dVar18,0);
    }
    else {
      uVar15 = SUB84(SQRT(dVar18),0);
    }
    console::printf("Average Non-Inf PSNR: %3.3f, Std dev: %3.3f",dVar19,uVar15);
    console::printf("Worst PSNR: %3.3f, Block Location: %i,%i",uVar13,uVar12);
    console::printf("Best Non-Inf PSNR: %3.3f, Block Location: %i,%i",dVar17,(ulong)uVar6,uVar5);
    return;
  }
  return;
}

Assistant:

void corpus_tester::print_metric_stats(const crnlib::vector<image_utils::error_metrics>& stats, uint num_blocks_x, uint /* num_blocks_y */) {
  image_utils::error_metrics best_metrics;
  image_utils::error_metrics worst_metrics;
  worst_metrics.mPeakSNR = 1e+6f;

  vec2I best_loc;
  vec2I worst_loc;
  utils::zero_object(best_loc);
  utils::zero_object(worst_loc);

  double psnr_total = 0.0f;
  double psnr2_total = 0.0f;
  uint num_non_inf = 0;
  uint num_inf = 0;

  for (uint i = 0; i < stats.size(); i++) {
    uint bx = i % num_blocks_x;
    uint by = i / num_blocks_x;

    const image_utils::error_metrics& em = stats[i];

    if ((em.mPeakSNR < 200.0f) && (em > best_metrics)) {
      best_metrics = em;
      best_loc.set(bx, by);
    }
    if (em < worst_metrics) {
      worst_metrics = em;
      worst_loc.set(bx, by);
    }

    if (em.mPeakSNR < 200.0f) {
      psnr_total += em.mPeakSNR;
      psnr2_total += em.mPeakSNR * em.mPeakSNR;
      num_non_inf++;
    } else {
      num_inf++;
    }
  }

  console::printf("Number of infinite PSNR blocks: %u", num_inf);
  console::printf("Number of non-infinite PSNR blocks: %u", num_non_inf);
  if (num_non_inf) {
    psnr_total /= num_non_inf;
    psnr2_total /= num_non_inf;

    double psnr_std_dev = sqrt(psnr2_total - psnr_total * psnr_total);

    console::printf("Average Non-Inf PSNR: %3.3f, Std dev: %3.3f", psnr_total, psnr_std_dev);
    console::printf("Worst PSNR: %3.3f, Block Location: %i,%i", worst_metrics.mPeakSNR, worst_loc[0], worst_loc[1]);
    console::printf("Best Non-Inf PSNR: %3.3f, Block Location: %i,%i", best_metrics.mPeakSNR, best_loc[0], best_loc[1]);
  }
}